

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O3

void __thiscall
IRBuilderAsmJs::BuildBrInt1Const1
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,int32 relativeOffset,
          RegSlot src1,int32 src2)

{
  ValueType VVar1;
  RegSlot srcRegSlot;
  RegOpnd *src1Opnd;
  IntConstOpnd *this_00;
  
  srcRegSlot = GetRegSlotFromTypedReg(this,src1,INT32);
  src1Opnd = BuildSrcOpnd(this,srcRegSlot,TyInt32);
  VVar1 = ValueType::GetInt(false);
  IR::Opnd::SetValueType(&src1Opnd->super_Opnd,VVar1);
  this_00 = IR::IntConstOpnd::New((long)src2,TyInt32,this->m_func,false);
  VVar1 = ValueType::GetInt(false);
  IR::Opnd::SetValueType(&this_00->super_Opnd,VVar1);
  BuildBrCmp(this,newOpcode,offset,relativeOffset,src1Opnd,&this_00->super_Opnd);
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildBrInt1Const1(Js::OpCodeAsmJs newOpcode, uint32 offset, int32 relativeOffset, Js::RegSlot src1, int32 src2)
{
    Js::RegSlot src1RegSlot = GetRegSlotFromIntReg(src1);

    IR::RegOpnd * src1Opnd = BuildSrcOpnd(src1RegSlot, TyInt32);
    src1Opnd->SetValueType(ValueType::GetInt(false));

    IR::Opnd * src2Opnd = IR::IntConstOpnd::New(src2, TyInt32, this->m_func);
    src2Opnd->SetValueType(ValueType::GetInt(false));

    BuildBrCmp(newOpcode, offset, relativeOffset, src1Opnd, src2Opnd);
}